

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O3

void wallet::coinselector_tests::add_coin
               (CAmount *nValue,int nInput,SelectionResult *result,CAmount fee,CAmount long_term_fee
               )

{
  undefined8 uVar1;
  ulong uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  bool local_131;
  int local_130;
  bool local_12b;
  bool local_12a;
  bool local_129;
  int local_128 [2];
  shared_ptr<wallet::COutput> coin;
  CMutableTransaction tx;
  CAmount fee_local;
  undefined1 local_c9;
  OutputGroup group;
  Txid local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  fee_local = fee;
  CMutableTransaction::CMutableTransaction(&tx);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx.vout,(ulong)(nInput + 1));
  uVar3 = (ulong)(uint)nInput;
  tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[uVar3].nValue = *nValue;
  tx.nLockTime = nextLockTime;
  nextLockTime = nextLockTime + 1;
  CMutableTransaction::GetHash(&local_58,&tx);
  group.m_outputs.
  super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems._20_4_,
                         local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_4_);
  group.m_from_me = (bool)local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18];
  group._25_1_ = local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19];
  group._26_1_ = local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a];
  group._27_1_ = local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b];
  group._28_1_ = local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c];
  group._29_1_ = local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d];
  group._30_1_ = local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e];
  group._31_1_ = local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f];
  group.m_outputs.
  super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems._4_4_,
                         local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_4_);
  group.m_outputs.
  super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems._12_4_,
                         local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_4_);
  group.m_value = CONCAT44(group.m_value._4_4_,nInput);
  uVar2 = ((long)tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  if (uVar2 < uVar3 || uVar2 - uVar3 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      uVar1 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar3);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&tx.vout);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&tx.vin);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        _Unwind_Resume(uVar1);
      }
    }
  }
  else {
    local_128[1] = 1;
    local_128[0] = 0x94;
    local_129 = true;
    local_12a = true;
    local_12b = true;
    local_130 = 0;
    local_131 = false;
    coin.super___shared_ptr<wallet::COutput,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<wallet::COutput,std::allocator<wallet::COutput>,COutPoint,CTxOut&,int,int,bool,bool,bool,int,bool,long&>
              (&coin.super___shared_ptr<wallet::COutput,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (COutput **)&coin,(allocator<wallet::COutput> *)&local_c9,(COutPoint *)&group,
               tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start + uVar3,local_128 + 1,local_128,&local_129,
               &local_12a,&local_12b,&local_130,&local_131,&fee_local);
    group.m_outputs.
    super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    group.m_outputs.
    super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    group.m_outputs.
    super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    group.m_from_me = true;
    group.m_value = 0;
    group.m_depth = 999;
    group.m_weight = 0;
    group.m_ancestors = 0;
    group.m_descendants = 0;
    group.effective_value = 0;
    group.fee = 0;
    group.long_term_fee = 0;
    group.m_long_term_feerate.nSatoshisPerK = 0;
    group.m_subtract_fee_outputs = false;
    OutputGroup::Insert(&group,&coin,0,0);
    (coin.super___shared_ptr<wallet::COutput,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->long_term_fee =
         long_term_fee;
    SelectionResult::AddInput(result,&group);
    std::
    vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>::
    ~vector(&group.m_outputs);
    if (coin.super___shared_ptr<wallet::COutput,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (coin.super___shared_ptr<wallet::COutput,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&tx.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&tx.vin);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

static void add_coin(const CAmount& nValue, int nInput, SelectionResult& result, CAmount fee, CAmount long_term_fee)
{
    CMutableTransaction tx;
    tx.vout.resize(nInput + 1);
    tx.vout[nInput].nValue = nValue;
    tx.nLockTime = nextLockTime++;        // so all transactions get different hashes
    std::shared_ptr<COutput> coin = std::make_shared<COutput>(COutPoint(tx.GetHash(), nInput), tx.vout.at(nInput), /*depth=*/ 1, /*input_bytes=*/ 148, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, fee);
    OutputGroup group;
    group.Insert(coin, /*ancestors=*/ 0, /*descendants=*/ 0);
    coin->long_term_fee = long_term_fee; // group.Insert() will modify long_term_fee, so we need to set it afterwards
    result.AddInput(group);
}